

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O1

PICK_MODE_CONTEXT *
av1_alloc_pmc(AV1_COMP *cpi,BLOCK_SIZE bsize,PC_TREE_SHARED_BUFFERS *shared_bufs)

{
  uint8_t uVar1;
  int iVar2;
  PICK_MODE_CONTEXT *pPVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint16_t *puVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong num;
  bool bVar10;
  PICK_MODE_CONTEXT *ctx;
  aom_internal_error_info error;
  aom_internal_error_info local_1d0;
  
  iVar2 = _setjmp((__jmp_buf_tag *)local_1d0.jmp);
  if (iVar2 == 0) {
    local_1d0.setjmp = 1;
    pPVar3 = (PICK_MODE_CONTEXT *)aom_calloc(1,0x1d8);
    if (pPVar3 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx");
    }
    pPVar3->rd_mode_is_ready = 0;
    uVar1 = ((cpi->common).seq_params)->monochrome;
    uVar8 = (uint)block_size_high[bsize] * (uint)block_size_wide[bsize];
    uVar9 = uVar8 >> 4;
    num = (ulong)uVar9;
    puVar4 = (uint8_t *)aom_calloc(num,1);
    pPVar3->blk_skip = puVar4;
    if (pPVar3->blk_skip == (uint8_t *)0x0) {
      aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->blk_skip");
    }
    puVar4 = (uint8_t *)aom_calloc(num,1);
    pPVar3->tx_type_map = puVar4;
    if (pPVar3->tx_type_map == (uint8_t *)0x0) {
      aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->tx_type_map");
    }
    pPVar3->num_4x4_blk = uVar9;
    uVar5 = 0;
    do {
      pPVar3->coeff[uVar5] = shared_bufs->coeff_buf[uVar5];
      pPVar3->qcoeff[uVar5] = shared_bufs->qcoeff_buf[uVar5];
      pPVar3->dqcoeff[uVar5] = shared_bufs->dqcoeff_buf[uVar5];
      puVar6 = (uint16_t *)aom_memalign(0x20,(ulong)(uVar9 * 2));
      pPVar3->eobs[uVar5] = puVar6;
      if (pPVar3->eobs[uVar5] == (uint16_t *)0x0) {
        aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->eobs[i]");
      }
      puVar4 = (uint8_t *)aom_memalign(0x20,num);
      pPVar3->txb_entropy_ctx[uVar5] = puVar4;
      if (pPVar3->txb_entropy_ctx[uVar5] == (uint8_t *)0x0) {
        aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate ctx->txb_entropy_ctx[i]");
      }
    } while ((uVar1 == '\0') && (bVar10 = uVar5 < 2, uVar5 = uVar5 + 1, bVar10));
    if (uVar8 < 0x1001) {
      lVar7 = 0;
      do {
        if ((cpi->common).features.allow_screen_content_tools == true) {
          puVar4 = (uint8_t *)aom_memalign(0x20,(ulong)uVar8);
          pPVar3->color_index_map[lVar7] = puVar4;
          if (pPVar3->color_index_map[lVar7] == (uint8_t *)0x0) {
            aom_internal_error(&local_1d0,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate ctx->color_index_map[i]");
          }
        }
        else {
          pPVar3->color_index_map[lVar7] = (uint8_t *)0x0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
    }
    (pPVar3->rd_stats).rate = 0x7fffffff;
    (pPVar3->rd_stats).zero_rate = 0;
    (pPVar3->rd_stats).dist = 0x7fffffffffffffff;
    (pPVar3->rd_stats).rdcost = 0x7fffffffffffffff;
    (pPVar3->rd_stats).sse = 0x7fffffffffffffff;
    (pPVar3->rd_stats).skip_txfm = '\0';
  }
  else {
    av1_free_pmc((PICK_MODE_CONTEXT *)0x0,
                 (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    pPVar3 = (PICK_MODE_CONTEXT *)0x0;
  }
  return pPVar3;
}

Assistant:

PICK_MODE_CONTEXT *av1_alloc_pmc(const struct AV1_COMP *const cpi,
                                 BLOCK_SIZE bsize,
                                 PC_TREE_SHARED_BUFFERS *shared_bufs) {
  PICK_MODE_CONTEXT *volatile ctx = NULL;
  const AV1_COMMON *const cm = &cpi->common;
  struct aom_internal_error_info error;

  if (setjmp(error.jmp)) {
    av1_free_pmc(ctx, av1_num_planes(cm));
    return NULL;
  }
  error.setjmp = 1;

  AOM_CHECK_MEM_ERROR(&error, ctx, aom_calloc(1, sizeof(*ctx)));
  ctx->rd_mode_is_ready = 0;

  const int num_planes = av1_num_planes(cm);
  const int num_pix = block_size_wide[bsize] * block_size_high[bsize];
  const int num_blk = num_pix / 16;

  AOM_CHECK_MEM_ERROR(&error, ctx->blk_skip,
                      aom_calloc(num_blk, sizeof(*ctx->blk_skip)));
  AOM_CHECK_MEM_ERROR(&error, ctx->tx_type_map,
                      aom_calloc(num_blk, sizeof(*ctx->tx_type_map)));
  ctx->num_4x4_blk = num_blk;

  for (int i = 0; i < num_planes; ++i) {
    ctx->coeff[i] = shared_bufs->coeff_buf[i];
    ctx->qcoeff[i] = shared_bufs->qcoeff_buf[i];
    ctx->dqcoeff[i] = shared_bufs->dqcoeff_buf[i];
    AOM_CHECK_MEM_ERROR(&error, ctx->eobs[i],
                        aom_memalign(32, num_blk * sizeof(*ctx->eobs[i])));
    AOM_CHECK_MEM_ERROR(
        &error, ctx->txb_entropy_ctx[i],
        aom_memalign(32, num_blk * sizeof(*ctx->txb_entropy_ctx[i])));
  }

  if (num_pix <= MAX_PALETTE_SQUARE) {
    for (int i = 0; i < 2; ++i) {
      if (cm->features.allow_screen_content_tools) {
        AOM_CHECK_MEM_ERROR(
            &error, ctx->color_index_map[i],
            aom_memalign(32, num_pix * sizeof(*ctx->color_index_map[i])));
      } else {
        ctx->color_index_map[i] = NULL;
      }
    }
  }

  av1_invalid_rd_stats(&ctx->rd_stats);

  return ctx;
}